

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t internal_exr_parse_header(_internal_exr_context *ctxt)

{
  byte bVar1;
  exr_attr_preview_t *peVar2;
  undefined1 auVar3 [16];
  undefined8 __s1;
  exr_attr_chlist_t eVar4;
  _internal_exr_part *curpart_00;
  exr_result_t eVar5;
  int iVar6;
  uint8_t *puVar7;
  exr_attr_box2i_t *peVar8;
  uint uVar9;
  char *pcVar10;
  exr_storage_t eVar11;
  char *pcVar12;
  ulong uVar13;
  uint64_t uVar14;
  exr_attribute_t **ppeVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint8_t next_byte;
  uint8_t *outstr;
  _internal_exr_seq_scratch scratch;
  int32_t typelen;
  exr_attribute_t *nattr;
  _internal_exr_part *curpart;
  uint32_t flags;
  uint8_t *strptr;
  char type [256];
  char name [256];
  uint64_t initpos;
  uint8_t maxval;
  int32_t iVar20;
  uint local_2d0;
  byte local_2c9;
  exr_attr_chlist_t local_2c8;
  undefined1 local_2b0 [16];
  _internal_exr_seq_scratch *p_Stack_2a0;
  uint64_t local_298;
  _func_exr_result_t__internal_exr_seq_scratch_ptr_void_ptr_uint64_t *local_290;
  _func_exr_result_t__internal_exr_seq_scratch_ptr_uint64_t *local_288;
  _internal_exr_context *local_280;
  uint64_t local_278;
  exr_attribute_t **local_270;
  exr_attribute_list_t *local_268;
  int32_t local_260;
  int32_t local_25c;
  exr_attribute_t *local_258;
  _internal_exr_part *local_250;
  uint local_248;
  int32_t local_244;
  uint8_t *local_240;
  undefined4 local_238;
  short sStack_234;
  undefined1 uStack_232;
  undefined1 uStack_231;
  int local_230;
  byte local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char cStack_128;
  char cStack_127;
  char cStack_126;
  uint64_t local_38;
  
  if (ctxt->silent_header != '\0') {
    ctxt->standard_error = silent_standard_error;
    ctxt->report_error = silent_error;
    ctxt->print_error = silent_print_error;
  }
  eVar5 = read_magic_and_flags(ctxt,&local_248,&local_38);
  if (eVar5 == 0) {
    stack0xfffffffffffffd58 = (undefined1  [16])0x0;
    local_298 = local_38;
    local_290 = scratch_seq_read;
    local_288 = scratch_seq_skip;
    local_280 = ctxt;
    puVar7 = (uint8_t *)(*ctxt->alloc_fn)(0x1000);
    local_2b0._0_8_ = puVar7;
    if ((puVar7 != (uint8_t *)0x0) || (eVar5 = (*ctxt->standard_error)(ctxt,1), eVar5 == 0)) {
      local_250 = *ctxt->parts;
      if (local_250 == (_internal_exr_part *)0x0) {
        eVar5 = (*ctxt->report_error)(ctxt,3,"Error during file initialization");
      }
      else {
        eVar11 = EXR_STORAGE_SCANLINE;
        uVar9 = local_248 >> 0xb;
        ctxt->is_singlepart_tiled = (byte)(local_248 >> 9) & 1;
        ctxt->max_name_length =
             -(ctxt->strict_header == '\0') | -((local_248 >> 10 & 1) != 0) | 0x1f;
        ctxt->has_nonimage_data = (byte)uVar9 & 1;
        ctxt->is_multipart = (byte)(local_248 >> 0xc) & 1;
        if (((local_248 >> 9 & 1) == 0) ||
           (eVar11 = EXR_STORAGE_TILED, (uVar9 & 1) == 0 && (local_248 >> 0xc & 1) == 0)) {
LAB_0011ceec:
          local_250->storage_mode = eVar11;
          eVar5 = scratch_seq_read((_internal_exr_seq_scratch *)local_2b0,&local_2c9,1);
          if (eVar5 == 0) {
            do {
              if (local_2c9 == 0) {
                eVar5 = internal_exr_validate_read_part(ctxt,local_250);
                if (eVar5 != 0) goto LAB_0011cf19;
                if (ctxt->is_multipart != '\0') {
                  eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c9,1);
                  if (eVar5 != 0) {
                    pcVar12 = "Unable to go to next part definition";
                    goto LAB_0011cf0e;
                  }
                  if (local_2c9 != 0) {
                    eVar5 = internal_exr_add_part(ctxt,&local_250,(int *)0x0);
                    if (eVar5 == 0) goto LAB_0011cf5d;
                    goto LAB_0011d0ce;
                  }
                }
                eVar5 = update_chunk_offsets(ctxt,p_Stack_2a0);
                goto LAB_0011e65a;
              }
LAB_0011cf5d:
              curpart_00 = local_250;
              local_260 = 0;
              local_2d0 = 0;
              local_258 = (exr_attribute_t *)0x0;
              local_240 = (uint8_t *)0x0;
              bVar1 = ctxt->max_name_length;
              local_138 = local_2c9;
              local_25c = 1;
              eVar5 = read_text(ctxt,(char *)&local_138,&local_25c,(uint)bVar1,
                                (_internal_exr_seq_scratch *)local_2b0,"attribute name");
              if ((eVar5 != 0) ||
                 (eVar5 = read_text(ctxt,(char *)&local_238,&local_260,(uint)bVar1,
                                    (_internal_exr_seq_scratch *)local_2b0,"attribute type"),
                 eVar5 != 0)) goto LAB_0011d0ce;
              if (local_25c == 0) {
                eVar5 = (*ctxt->report_error)
                                  (ctxt,6,"Invalid empty string encountered parsing attribute name")
                ;
                goto LAB_0011d0c9;
              }
              if (local_260 == 0) {
                eVar5 = (*ctxt->print_error)
                                  (ctxt,6,
                                   "Invalid empty string encountered parsing attribute type for attribute \'%s\'"
                                   ,&local_138);
                goto LAB_0011d0c9;
              }
              eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2d0,4);
              uVar9 = local_2d0;
              if (eVar5 != 0) {
                pcVar12 = "Unable to read attribute size for attribute \'%s\', type \'%s\'";
                goto LAB_0011d087;
              }
              if (0x13 < local_138 - 99) goto switchD_0011d11f_caseD_65;
              uVar13 = (ulong)local_2d0;
              uVar14 = (uint64_t)(int)local_2d0;
              switch((uint)local_138) {
              case 99:
                if (cStack_130 == '\0' &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x736c656e6e616863) {
                  local_2c8.num_channels = 0;
                  local_2c8.num_alloced = 0;
                  local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                  if (curpart_00->channels != (exr_attribute_t *)0x0) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "Duplicate copy of required attribute \'channels\' encountered";
                    goto LAB_0011d5e3;
                  }
                  if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x747369 &&
                      local_238 == 0x696c6863) {
                    eVar5 = extract_attr_chlist(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                                &local_2c8,"channels",(char *)&local_238,local_2d0);
                    if (eVar5 == 0) {
                      ppeVar15 = &curpart_00->channels;
                      eVar5 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&curpart_00->attributes,"channels",
                                         EXR_ATTR_CHLIST,0,(uint8_t **)0x0,ppeVar15);
                      if (eVar5 != 0) {
                        exr_attr_chlist_destroy((exr_context_t)ctxt,&local_2c8);
                        pcVar12 = "Unable to initialize attribute \'%s\', type \'chlist\'";
                        pcVar10 = "channels";
                        goto LAB_0011dc3e;
                      }
                      exr_attr_chlist_destroy((exr_context_t)ctxt,((*ppeVar15)->field_6).chlist);
                      eVar4 = local_2c8;
                      peVar2 = ((*ppeVar15)->field_6).preview;
                      peVar2->width = local_2c8.num_channels;
                      peVar2->height = local_2c8.num_alloced;
                      peVar2->alloc_size = (size_t)local_2c8.entries;
                      local_2c8 = eVar4;
LAB_0011e57b:
                      eVar5 = 0;
                    }
                    else {
                      exr_attr_chlist_destroy((exr_context_t)ctxt,&local_2c8);
                    }
                    goto LAB_0011dc46;
                  }
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                  pcVar12 = "Required attribute \'channels\': Invalid type \'%s\'";
LAB_0011dc36:
                  eVar5 = 0x10;
                  pcVar10 = (char *)&local_238;
                }
                else {
                  if (CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) !=
                      0x6e6f69 ||
                      CONCAT17(cStack_131,
                               CONCAT16(cStack_132,
                                        CONCAT15(cStack_133,
                                                 CONCAT14(cStack_134,
                                                          CONCAT13(cStack_135,
                                                                   CONCAT12(cStack_136,
                                                                            CONCAT11(cStack_137,
                                                                                     local_138))))))
                              ) != 0x73736572706d6f63) {
                    if (CONCAT17(cStack_12e,
                                 CONCAT16(cStack_12f,
                                          CONCAT15(cStack_130,
                                                   CONCAT14(cStack_131,
                                                            CONCAT13(cStack_132,
                                                                     CONCAT12(cStack_133,
                                                                              CONCAT11(cStack_134,
                                                                                       cStack_135)))
                                                           )))) == 0x746e756f436b6e &&
                        CONCAT17(cStack_131,
                                 CONCAT16(cStack_132,
                                          CONCAT15(cStack_133,
                                                   CONCAT14(cStack_134,
                                                            CONCAT13(cStack_135,
                                                                     CONCAT12(cStack_136,
                                                                              CONCAT11(cStack_137,
                                                                                       local_138))))
                                                  ))) == 0x756f436b6e756863) {
                      eVar5 = check_populate_chunk_count
                                        (ctxt,curpart_00,(_internal_exr_seq_scratch *)local_2b0,
                                         (char *)&local_238,local_2d0);
                      goto LAB_0011dc46;
                    }
                    break;
                  }
                  if (curpart_00->compression == (exr_attribute_t *)0x0) {
                    if (local_230 != 0x6e6f69 ||
                        CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                        0x73736572706d6f63) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "compression";
                      goto LAB_0011d907;
                    }
                    eVar5 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                               (uint8_t *)&local_2c8,"compression",
                                               (char *)&local_238,local_2d0,'\n');
                    if (eVar5 != 0) goto LAB_0011dc46;
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,"compression",
                                       EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,
                                       &curpart_00->compression);
                    if (eVar5 == 0) {
                      (curpart_00->compression->field_6).uc = (byte)local_2c8.num_channels;
                      curpart_00->comp_type = (uint)(byte)local_2c8.num_channels;
                      goto LAB_0011e57b;
                    }
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'compression\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "compression";
                }
                goto LAB_0011dc3e;
              case 100:
                if (CONCAT17(cStack_12e,
                             CONCAT16(cStack_12f,
                                      CONCAT15(cStack_130,
                                               CONCAT14(cStack_131,
                                                        CONCAT13(cStack_132,
                                                                 CONCAT12(cStack_133,
                                                                          CONCAT11(cStack_134,
                                                                                   cStack_135)))))))
                    == 0x776f646e695761 &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x646e695761746164) {
                  local_2c8.num_channels = 0;
                  local_2c8.num_alloced = 0;
                  local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                  if (curpart_00->dataWindow == (exr_attribute_t *)0x0) {
                    if (sStack_234 != 0x69 || local_238 != 0x32786f62) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "dataWindow";
LAB_0011d907:
                      eVar5 = (*ctxt->print_error)
                                        (ctxt,0x10,"Required attribute \'%s\': Invalid type \'%s\'",
                                         pcVar12);
                      goto LAB_0011dc46;
                    }
                    eVar5 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                               &local_2c8,"dataWindow",(char *)&local_238,local_2d0,
                                               4);
                    if (eVar5 != 0) goto LAB_0011dc46;
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,"dataWindow",
                                       EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&curpart_00->dataWindow);
                    if (eVar5 == 0) {
                      peVar8 = (curpart_00->dataWindow->field_6).box2i;
                      (peVar8->min).field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                      (peVar8->max).field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                      (curpart_00->data_window).min.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                      (curpart_00->data_window).max.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                      goto LAB_0011e57b;
                    }
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "dataWindow";
                }
                else {
                  if (CONCAT17(cStack_12b,
                               CONCAT16(cStack_12c,
                                        CONCAT15(cStack_12d,
                                                 CONCAT14(cStack_12e,
                                                          CONCAT13(cStack_12f,
                                                                   CONCAT12(cStack_130,
                                                                            CONCAT11(cStack_131,
                                                                                     cStack_132)))))
                                       )) != 0x776f646e695779 ||
                      CONCAT17(cStack_131,
                               CONCAT16(cStack_132,
                                        CONCAT15(cStack_133,
                                                 CONCAT14(cStack_134,
                                                          CONCAT13(cStack_135,
                                                                   CONCAT12(cStack_136,
                                                                            CONCAT11(cStack_137,
                                                                                     local_138))))))
                              ) != 0x5779616c70736964) break;
                  local_2c8.num_channels = 0;
                  local_2c8.num_alloced = 0;
                  local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                  if (curpart_00->displayWindow == (exr_attribute_t *)0x0) {
                    if (sStack_234 != 0x69 || local_238 != 0x32786f62) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "displayWindow";
                      goto LAB_0011d907;
                    }
                    eVar5 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                               &local_2c8,"displayWindow",(char *)&local_238,
                                               local_2d0,4);
                    if (eVar5 != 0) goto LAB_0011dc46;
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,"displayWindow",
                                       EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&curpart_00->displayWindow);
                    if (eVar5 == 0) {
                      peVar8 = (curpart_00->displayWindow->field_6).box2i;
                      (peVar8->min).field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                      (peVar8->max).field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                      (curpart_00->display_window).min.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                      (curpart_00->display_window).max.field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                      goto LAB_0011e57b;
                    }
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "displayWindow";
                }
                goto LAB_0011dc3e;
              case 0x6c:
                if (CONCAT11(cStack_12f,cStack_130) == 0x72 &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x6564724f656e696c) {
                  if (curpart_00->lineOrder == (exr_attribute_t *)0x0) {
                    if ((short)local_230 != 0x72 ||
                        CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                        0x6564724f656e696c) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "lineOrder";
                      goto LAB_0011d907;
                    }
                    eVar5 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                               (uint8_t *)&local_2c8,"lineOrder",(char *)&local_238,
                                               local_2d0,'\x03');
                    if (eVar5 != 0) goto LAB_0011dc46;
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,"lineOrder",
                                       EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&curpart_00->lineOrder);
                    if (eVar5 == 0) {
                      (curpart_00->lineOrder->field_6).uc = (byte)local_2c8.num_channels;
                      curpart_00->lineorder = (uint)(byte)local_2c8.num_channels;
                      goto LAB_0011e57b;
                    }
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'lineOrder\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "lineOrder";
                  goto LAB_0011dc3e;
                }
                break;
              case 0x6e:
                if (cStack_134 == '\0' &&
                    CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) ==
                    0x656d616e) {
                  local_278 = uVar14;
                  eVar5 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,local_2d0,1,
                                           "name",(char *)&local_238,&local_244);
                  if (eVar5 == 0) {
                    if (curpart_00->name == (exr_attribute_t *)0x0) {
                      if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x676e69 &&
                          local_238 == 0x69727473) {
                        local_270 = &curpart_00->name;
                        local_268 = &curpart_00->attributes;
                        eVar5 = exr_attr_list_add_static_name
                                          ((exr_context_t)ctxt,local_268,"name",EXR_ATTR_STRING,
                                           uVar9 + 1,(uint8_t **)&local_2c8,local_270);
                        if (eVar5 == 0) {
                          eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,
                                               (void *)local_2c8._0_8_,local_278);
                          if (eVar5 == 0) {
                            *(char *)(local_2c8._0_8_ + local_278) = '\0';
                            eVar5 = exr_attr_string_init_static_with_length
                                              ((exr_context_t)ctxt,((*local_270)->field_6).string,
                                               (char *)local_2c8._0_8_,uVar9);
                            if (eVar5 == 0) goto LAB_0011e57b;
                          }
                          goto LAB_0011e50e;
                        }
                        (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                        pcVar12 = "Unable to initialize attribute \'%s\', type \'string\'";
                        pcVar10 = "name";
                        goto LAB_0011dc3e;
                      }
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                      pcVar12 = "attribute \'name\': Invalid type \'%s\'";
                      goto LAB_0011dc36;
                    }
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                    pcVar12 = "Duplicate copy of required attribute \'name\' encountered";
                    goto LAB_0011d5e3;
                  }
                  goto LAB_0011dc46;
                }
                break;
              case 0x70:
                if ((cStack_128 == '\0' &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x7073416c65786970) &&
                    CONCAT17(cStack_129,
                             CONCAT16(cStack_12a,
                                      CONCAT15(cStack_12b,
                                               CONCAT14(cStack_12c,
                                                        CONCAT13(cStack_12d,
                                                                 CONCAT12(cStack_12e,
                                                                          CONCAT11(cStack_12f,
                                                                                   cStack_130)))))))
                    == 0x6f69746152746365) {
                  if (curpart_00->pixelAspectRatio != (exr_attribute_t *)0x0) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
LAB_0011d517:
                    pcVar10 = "pixelAspectRatio";
                    goto LAB_0011dc3e;
                  }
                  if (sStack_234 != 0x74 || local_238 != 0x616f6c66) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "pixelAspectRatio";
                    goto LAB_0011d907;
                  }
                  if (local_2d0 == 4) {
                    eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                    if (eVar5 == 0) {
                      ppeVar15 = &curpart_00->pixelAspectRatio;
                      eVar5 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&curpart_00->attributes,
                                         "pixelAspectRatio",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,
                                         ppeVar15);
                      if (eVar5 == 0) {
LAB_0011e486:
                        ((*ppeVar15)->field_6).i = local_2c8.num_channels;
                        goto LAB_0011e57b;
                      }
                      pcVar12 = "Unable to initialize attribute \'%s\', type \'float\'";
                      goto LAB_0011d517;
                    }
                    pcVar12 = "pixelAspectRatio";
LAB_0011db79:
                    pcVar10 = "Attribute \'%s\': Unable to read data (%d bytes)";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0x11;
                    pcVar10 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                    pcVar12 = "pixelAspectRatio";
                  }
LAB_0011e252:
                  eVar5 = (*ctxt->print_error)(ctxt,eVar5,pcVar10,pcVar12);
                  goto LAB_0011dc46;
                }
                break;
              case 0x73:
                auVar16[0] = -(cStack_135 == 'e');
                auVar16[1] = -(cStack_134 == 'e');
                auVar16[2] = -(cStack_133 == 'n');
                auVar16[3] = -(cStack_132 == 'W');
                auVar16[4] = -(cStack_131 == 'i');
                auVar16[5] = -(cStack_130 == 'n');
                auVar16[6] = -(cStack_12f == 'd');
                auVar16[7] = -(cStack_12e == 'o');
                auVar16[8] = -(cStack_12d == 'w');
                auVar16[9] = -(cStack_12c == 'C');
                auVar16[10] = -(cStack_12b == 'e');
                auVar16[0xb] = -(cStack_12a == 'n');
                auVar16[0xc] = -(cStack_129 == 't');
                auVar16[0xd] = -(cStack_128 == 'e');
                auVar16[0xe] = -(cStack_127 == 'r');
                auVar16[0xf] = -(cStack_126 == '\0');
                auVar18[0] = -(local_138 == 's');
                auVar18[1] = -(cStack_137 == 'c');
                auVar18[2] = -(cStack_136 == 'r');
                auVar18[3] = -(cStack_135 == 'e');
                auVar18[4] = -(cStack_134 == 'e');
                auVar18[5] = -(cStack_133 == 'n');
                auVar18[6] = -(cStack_132 == 'W');
                auVar18[7] = -(cStack_131 == 'i');
                auVar18[8] = -(cStack_130 == 'n');
                auVar18[9] = -(cStack_12f == 'd');
                auVar18[10] = -(cStack_12e == 'o');
                auVar18[0xb] = -(cStack_12d == 'w');
                auVar18[0xc] = -(cStack_12c == 'C');
                auVar18[0xd] = -(cStack_12b == 'e');
                auVar18[0xe] = -(cStack_12a == 'n');
                auVar18[0xf] = -(cStack_129 == 't');
                auVar18 = auVar18 & auVar16;
                if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
                  if (curpart_00->screenWindowCenter == (exr_attribute_t *)0x0) {
                    if (local_238 != 0x663276) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "screenWindowCenter";
                      goto LAB_0011d907;
                    }
                    if (local_2d0 != 8) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      eVar5 = (*ctxt->print_error)
                                        (ctxt,0x11,
                                         "Required attribute \'%s\': Invalid size %d (exp %lu)",
                                         "screenWindowCenter");
                      goto LAB_0011dc46;
                    }
                    eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,8);
                    if (eVar5 != 0) {
                      pcVar10 = "Attribute \'%s\': Unable to read data (%d bytes)";
                      pcVar12 = "screenWindowCenter";
                      goto LAB_0011e252;
                    }
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,
                                       "screenWindowCenter",EXR_ATTR_V2F,0,(uint8_t **)0x0,
                                       &curpart_00->screenWindowCenter);
                    if (eVar5 == 0) {
                      peVar8 = (curpart_00->screenWindowCenter->field_6).box2i;
LAB_0011e566:
                      (peVar8->min).field_0 =
                           (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                      goto LAB_0011e57b;
                    }
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'v2f\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "screenWindowCenter";
                }
                else {
                  auVar17[0] = -(cStack_128 == 'h');
                  auVar17[1] = -(cStack_127 == '\0');
                  auVar17[2] = 0xff;
                  auVar17[3] = 0xff;
                  auVar17[4] = 0xff;
                  auVar17[5] = 0xff;
                  auVar17[6] = 0xff;
                  auVar17[7] = 0xff;
                  auVar17[8] = 0xff;
                  auVar17[9] = 0xff;
                  auVar17[10] = 0xff;
                  auVar17[0xb] = 0xff;
                  auVar17[0xc] = 0xff;
                  auVar17[0xd] = 0xff;
                  auVar17[0xe] = 0xff;
                  auVar17[0xf] = 0xff;
                  auVar19[0] = -(local_138 == 's');
                  auVar19[1] = -(cStack_137 == 'c');
                  auVar19[2] = -(cStack_136 == 'r');
                  auVar19[3] = -(cStack_135 == 'e');
                  auVar19[4] = -(cStack_134 == 'e');
                  auVar19[5] = -(cStack_133 == 'n');
                  auVar19[6] = -(cStack_132 == 'W');
                  auVar19[7] = -(cStack_131 == 'i');
                  auVar19[8] = -(cStack_130 == 'n');
                  auVar19[9] = -(cStack_12f == 'd');
                  auVar19[10] = -(cStack_12e == 'o');
                  auVar19[0xb] = -(cStack_12d == 'w');
                  auVar19[0xc] = -(cStack_12c == 'W');
                  auVar19[0xd] = -(cStack_12b == 'i');
                  auVar19[0xe] = -(cStack_12a == 'd');
                  auVar19[0xf] = -(cStack_129 == 't');
                  auVar19 = auVar19 & auVar17;
                  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) break;
                  if (curpart_00->screenWindowWidth == (exr_attribute_t *)0x0) {
                    if (sStack_234 != 0x74 || local_238 != 0x616f6c66) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "screenWindowWidth";
                      goto LAB_0011d907;
                    }
                    if (local_2d0 != 4) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      eVar5 = 0x11;
                      pcVar10 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                      pcVar12 = "screenWindowWidth";
                      goto LAB_0011e252;
                    }
                    eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                    if (eVar5 != 0) {
                      pcVar12 = "screenWindowWidth";
                      goto LAB_0011db79;
                    }
                    ppeVar15 = &curpart_00->screenWindowWidth;
                    eVar5 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&curpart_00->attributes,
                                       "screenWindowWidth",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,ppeVar15
                                      );
                    if (eVar5 == 0) goto LAB_0011e486;
                    pcVar12 = "Unable to initialize attribute \'%s\', type \'float\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    eVar5 = 0xe;
                    pcVar12 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  pcVar10 = "screenWindowWidth";
                }
LAB_0011dc3e:
                eVar5 = (*ctxt->print_error)(ctxt,eVar5,pcVar12,pcVar10);
LAB_0011dc46:
                if (eVar5 == 0x20) break;
                goto LAB_0011d0c9;
              case 0x74:
                if (CONCAT11(cStack_133,cStack_134) == 0x73 &&
                    CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) ==
                    0x656c6974) {
                  local_2c8.entries._0_1_ = 0;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_2c8.entries;
                  local_2c8 = (exr_attr_chlist_t)(auVar3 << 0x40);
                  if (curpart_00->tiles == (exr_attribute_t *)0x0) {
                    if ((char)local_230 != '\0' ||
                        CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                        0x63736564656c6974) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      pcVar12 = "Required attribute \'tiles\': Invalid type \'%s\'";
                      goto LAB_0011dc36;
                    }
                    if (local_2d0 == 9) {
                      eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,9);
                      if (eVar5 == 0) {
                        eVar5 = exr_attr_list_add_static_name
                                          ((exr_context_t)ctxt,&curpart_00->attributes,"tiles",
                                           EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&curpart_00->tiles);
                        if (eVar5 == 0) {
                          peVar8 = (exr_attr_box2i_t *)(curpart_00->tiles->field_6).tiledesc;
                          *(undefined1 *)&(peVar8->max).field_0 = local_2c8.entries._0_1_;
                          goto LAB_0011e566;
                        }
                        pcVar12 = "Unable to initialize attribute \'%s\', type \'tiledesc\'";
                        pcVar10 = "tiles";
                        goto LAB_0011dc3e;
                      }
                      pcVar12 = "Unable to read \'tiles\' data";
LAB_0011e53a:
                      eVar5 = (*ctxt->report_error)(ctxt,eVar5,pcVar12);
                    }
                    else {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                      eVar5 = (*ctxt->print_error)
                                        (ctxt,0x10,
                                         "Required attribute \'tiles\': Invalid size %d (exp %lu)",
                                         uVar13);
                    }
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "Duplicate copy of required attribute \'tiles\' encountered";
LAB_0011d5e3:
                    eVar5 = (*ctxt->print_error)(ctxt,0xe,pcVar12);
                  }
                }
                else {
                  if (cStack_134 != '\0' ||
                      CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) !=
                      0x65707974) break;
                  local_278 = uVar14;
                  eVar5 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,local_2d0,1,
                                           "type",(char *)&local_238,&local_244);
                  if (eVar5 == 0) {
                    if (curpart_00->type == (exr_attribute_t *)0x0) {
                      if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) != 0x676e69 ||
                          local_238 != 0x69727473) {
                        (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                        pcVar12 = "Required attribute \'type\': Invalid type \'%s\'";
                        goto LAB_0011dc36;
                      }
                      local_270 = &curpart_00->type;
                      local_268 = &curpart_00->attributes;
                      eVar5 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,local_268,"type",EXR_ATTR_STRING,
                                         uVar9 + 1,(uint8_t **)&local_2c8,local_270);
                      if (eVar5 == 0) {
                        eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,
                                             (void *)local_2c8._0_8_,local_278);
                        if (eVar5 == 0) {
                          *(char *)(local_2c8._0_8_ + local_278) = '\0';
                          eVar5 = exr_attr_string_init_static_with_length
                                            ((exr_context_t)ctxt,((*local_270)->field_6).string,
                                             (char *)local_2c8._0_8_,uVar9);
                          if (eVar5 == 0) {
                            __s1 = local_2c8._0_8_;
                            iVar6 = strcmp((char *)local_2c8._0_8_,"scanlineimage");
                            if (iVar6 == 0) {
                              curpart_00->storage_mode = EXR_STORAGE_SCANLINE;
                            }
                            else {
                              iVar6 = strcmp((char *)__s1,"tiledimage");
                              if (iVar6 == 0) {
                                curpart_00->storage_mode = EXR_STORAGE_TILED;
                              }
                              else {
                                iVar6 = strcmp((char *)__s1,"deepscanline");
                                if (iVar6 == 0) {
                                  curpart_00->storage_mode = EXR_STORAGE_DEEP_SCANLINE;
                                }
                                else {
                                  iVar6 = strcmp((char *)__s1,"deeptile");
                                  if (iVar6 != 0) {
                                    eVar5 = (*ctxt->print_error)
                                                      (ctxt,0xe,
                                                  "attribute \'type\': Invalid type string \'%s\'",
                                                  __s1);
                                    ppeVar15 = local_270;
                                    exr_attr_list_remove((exr_context_t)ctxt,local_268,*local_270);
                                    *ppeVar15 = (exr_attribute_t *)0x0;
                                    goto LAB_0011dc46;
                                  }
                                  curpart_00->storage_mode = EXR_STORAGE_DEEP_TILED;
                                }
                              }
                            }
                            goto LAB_0011e57b;
                          }
                        }
LAB_0011e50e:
                        ppeVar15 = local_270;
                        exr_attr_list_remove((exr_context_t)ctxt,local_268,*local_270);
                        *ppeVar15 = (exr_attribute_t *)0x0;
                        pcVar12 = "Unable to read \'name\' data";
                        goto LAB_0011e53a;
                      }
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                      pcVar12 = "Unable to initialize attribute \'%s\', type \'string\'";
                      pcVar10 = "type";
                      goto LAB_0011dc3e;
                    }
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,local_278);
                    pcVar12 = "Duplicate copy of required attribute \'type\' encountered";
                    goto LAB_0011d5e3;
                  }
                }
                goto LAB_0011dc46;
              case 0x76:
                if (CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x6e6f6973726576) {
                  local_2c8.num_channels = local_2d0;
                  if (curpart_00->version != (exr_attribute_t *)0x0) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "Duplicate copy of required attribute \'version\' encountered";
                    goto LAB_0011d5e3;
                  }
                  if (local_238 != 0x746e69) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "attribute \'version\': Invalid type \'%s\'";
                    goto LAB_0011dc36;
                  }
                  if (local_2d0 == 4) {
                    eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                    if (eVar5 != 0) {
                      pcVar12 = "Unable to read version data";
                      goto LAB_0011e53a;
                    }
                    if (local_2c8.num_channels == 1) {
                      eVar5 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&curpart_00->attributes,"version",
                                         EXR_ATTR_INT,0,(uint8_t **)0x0,&curpart_00->version);
                      if (eVar5 == 0) {
                        (curpart_00->version->field_6).i = local_2c8.num_channels;
                        goto LAB_0011e57b;
                      }
                      pcVar12 = "Unable to initialize attribute \'%s\', type \'int\'";
                      pcVar10 = "version";
                      goto LAB_0011dc3e;
                    }
                    pcVar12 = "Invalid version %d: expect 1";
                    uVar9 = local_2c8.num_channels;
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,uVar14);
                    pcVar12 = "attribute \'version\': Invalid size %d (exp 4)";
                  }
                  eVar5 = (*ctxt->print_error)(ctxt,0xe,pcVar12,(ulong)uVar9);
                  goto LAB_0011dc46;
                }
              }
switchD_0011d11f_caseD_65:
              if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x676e69 &&
                  local_238 == 0x69727473) {
                eVar5 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,local_2d0,1,
                                         (char *)&local_138,(char *)&local_238,
                                         &local_2c8.num_channels);
                if (eVar5 == 0) {
                  eVar5 = exr_attr_list_add((exr_context_t)ctxt,&curpart_00->attributes,
                                            (char *)&local_138,EXR_ATTR_STRING,
                                            local_2c8.num_channels + 1,&local_240,&local_258);
                  goto LAB_0011dc9e;
                }
                goto LAB_0011d0ce;
              }
              eVar5 = exr_attr_list_add_by_type
                                ((exr_context_t)ctxt,&curpart_00->attributes,(char *)&local_138,
                                 (char *)&local_238,0,(uint8_t **)0x0,&local_258);
LAB_0011dc9e:
              if (eVar5 != 0) {
                pcVar12 = "Unable to initialize attribute \'%s\', type \'%s\'";
LAB_0011d087:
                eVar5 = (*ctxt->print_error)(ctxt,eVar5,pcVar12,&local_138,&local_238);
LAB_0011d0c9:
                if (eVar5 != 0) goto LAB_0011d0ce;
                goto LAB_0011d0d8;
              }
              switch(local_258->type) {
              case EXR_ATTR_BOX2I:
              case EXR_ATTR_BOX2F:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 4;
                goto LAB_0011df77;
              case EXR_ATTR_CHLIST:
                eVar5 = extract_attr_chlist(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                            (local_258->field_6).chlist,(char *)&local_138,
                                            (char *)&local_238,local_2d0);
                break;
              case EXR_ATTR_CHROMATICITIES:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 8;
                goto LAB_0011df77;
              case EXR_ATTR_COMPRESSION:
                maxval = '\n';
                goto LAB_0011df19;
              case EXR_ATTR_DOUBLE:
                peVar8 = (exr_attr_box2i_t *)&local_258->field_6;
                iVar20 = 1;
                goto LAB_0011df48;
              case EXR_ATTR_ENVMAP:
                maxval = '\x02';
                goto LAB_0011df19;
              case EXR_ATTR_FLOAT:
              case EXR_ATTR_INT:
                peVar8 = (exr_attr_box2i_t *)&local_258->field_6;
                iVar20 = 1;
                goto LAB_0011df77;
              case EXR_ATTR_FLOAT_VECTOR:
                eVar5 = extract_attr_float_vector
                                  (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                   (local_258->field_6).floatvector,(char *)&local_138,
                                   (char *)&local_238,local_2d0);
                break;
              case EXR_ATTR_KEYCODE:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 7;
                goto LAB_0011df77;
              case EXR_ATTR_LINEORDER:
                maxval = '\x03';
LAB_0011df19:
                eVar5 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                           &(local_258->field_6).uc,(char *)&local_138,
                                           (char *)&local_238,local_2d0,maxval);
                break;
              case EXR_ATTR_M33F:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 9;
                goto LAB_0011df77;
              case EXR_ATTR_M33D:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 9;
                goto LAB_0011df48;
              case EXR_ATTR_M44F:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 0x10;
                goto LAB_0011df77;
              case EXR_ATTR_M44D:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 0x10;
                goto LAB_0011df48;
              case EXR_ATTR_PREVIEW:
                eVar5 = extract_attr_preview
                                  (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                   (local_258->field_6).preview,(char *)&local_138,
                                   (char *)&local_238,local_2d0);
                break;
              case EXR_ATTR_RATIONAL:
              case EXR_ATTR_TIMECODE:
              case EXR_ATTR_V2I:
              case EXR_ATTR_V2F:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 2;
                goto LAB_0011df77;
              case EXR_ATTR_STRING:
                eVar5 = extract_attr_string(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                            (local_258->field_6).string,(char *)&local_138,
                                            (char *)&local_238,local_2d0,(char *)local_240);
                break;
              case EXR_ATTR_STRING_VECTOR:
                eVar5 = extract_attr_string_vector
                                  (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                   (local_258->field_6).stringvector,(char *)&local_138,
                                   (char *)&local_238,local_2d0);
                break;
              case EXR_ATTR_TILEDESC:
                eVar5 = extract_attr_tiledesc
                                  (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                   (local_258->field_6).tiledesc,(char *)&local_138,
                                   (char *)&local_238,local_2d0);
                break;
              case EXR_ATTR_V2D:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 2;
                goto LAB_0011df48;
              case EXR_ATTR_V3I:
              case EXR_ATTR_V3F:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 3;
LAB_0011df77:
                eVar5 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,peVar8,
                                           (char *)&local_138,(char *)&local_238,local_2d0,iVar20);
                break;
              case EXR_ATTR_V3D:
                peVar8 = (local_258->field_6).box2i;
                iVar20 = 3;
LAB_0011df48:
                eVar5 = extract_attr_64bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,peVar8,
                                           (char *)&local_138,(char *)&local_238,local_2d0,iVar20);
                break;
              case EXR_ATTR_OPAQUE:
                eVar5 = extract_attr_opaque(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                            (local_258->field_6).opaque,(char *)&local_138,
                                            (char *)&local_238,local_2d0);
                break;
              default:
                eVar5 = (*ctxt->print_error)
                                  (ctxt,3,"Invalid type \'%s\' for attribute \'%s\'",&local_238,
                                   &local_138);
              }
              if (eVar5 != 0) {
                exr_attr_list_remove((exr_context_t)ctxt,&curpart_00->attributes,local_258);
LAB_0011d0ce:
                if (ctxt->strict_header != '\0') {
LAB_0011e65a:
                  if ((uint8_t *)local_2b0._0_8_ != (uint8_t *)0x0) {
                    (*local_280->free_fn)((void *)local_2b0._0_8_);
                  }
                  goto LAB_0011cf32;
                }
              }
LAB_0011d0d8:
              eVar5 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c9,1);
            } while (eVar5 == 0);
          }
          pcVar12 = "Unable to extract header byte";
LAB_0011cf0e:
          eVar5 = (*ctxt->report_error)(ctxt,6,pcVar12);
LAB_0011cf19:
          if ((uint8_t *)local_2b0._0_8_ != (uint8_t *)0x0) {
            (*local_280->free_fn)((void *)local_2b0._0_8_);
          }
LAB_0011cf32:
          eVar5 = internal_exr_context_restore_handlers(ctxt,eVar5);
          return eVar5;
        }
        if (ctxt->strict_header == '\0') {
          ctxt->is_singlepart_tiled = '\0';
          goto LAB_0011ceec;
        }
        eVar5 = (*ctxt->print_error)
                          (ctxt,6,
                           "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)"
                           ,(ulong)(uVar9 & 1),(ulong)(local_248 >> 0xc & 1));
      }
      if (puVar7 != (uint8_t *)0x0) {
        (*ctxt->free_fn)(puVar7);
      }
    }
  }
  eVar5 = internal_exr_context_restore_handlers(ctxt,eVar5);
  return eVar5;
}

Assistant:

exr_result_t
internal_exr_parse_header (struct _internal_exr_context* ctxt)
{
    struct _internal_exr_seq_scratch scratch;
    struct _internal_exr_part*       curpart;
    uint32_t                         flags;
    uint64_t                         initpos;
    uint8_t                          next_byte;
    exr_result_t                     rv = EXR_ERR_UNKNOWN;

    if (ctxt->silent_header)
    {
        ctxt->standard_error = &silent_standard_error;
        ctxt->report_error   = &silent_error;
        ctxt->print_error    = &silent_print_error;
    }
    rv = read_magic_and_flags (ctxt, &flags, &initpos);
    if (rv != EXR_ERR_SUCCESS)
        return internal_exr_context_restore_handlers (ctxt, rv);

    rv = priv_init_scratch (ctxt, &scratch, initpos);
    if (rv != EXR_ERR_SUCCESS)
    {
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    curpart = ctxt->parts[0];
    if (!curpart)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Error during file initialization");
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    ctxt->is_singlepart_tiled = (flags & EXR_TILED_FLAG) ? 1 : 0;
    if (ctxt->strict_header)
    {
        ctxt->max_name_length = (flags & EXR_LONG_NAMES_FLAG)
                                    ? EXR_LONGNAME_MAXLEN
                                    : EXR_SHORTNAME_MAXLEN;
    }
    else
    {
        ctxt->max_name_length = EXR_LONGNAME_MAXLEN;
    }
    ctxt->has_nonimage_data = (flags & EXR_NON_IMAGE_FLAG) ? 1 : 0;
    ctxt->is_multipart      = (flags & EXR_MULTI_PART_FLAG) ? 1 : 0;
    if (ctxt->is_singlepart_tiled)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            if (ctxt->strict_header)
            {
                rv = ctxt->print_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)",
                    (int) ctxt->has_nonimage_data,
                    (int) ctxt->is_multipart);
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }
            else
            {
                // assume multipart for now
                ctxt->is_singlepart_tiled = 0;
            }
        }
        curpart->storage_mode = EXR_STORAGE_TILED;
    }
    else
        curpart->storage_mode = EXR_STORAGE_SCANLINE;

    do
    {
        rv = scratch.sequential_read (&scratch, &next_byte, 1);
        if (rv != EXR_ERR_SUCCESS)
        {
            rv = ctxt->report_error (
                ctxt, EXR_ERR_FILE_BAD_HEADER, "Unable to extract header byte");
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }

        if (next_byte == '\0')
        {
            rv = internal_exr_validate_read_part (ctxt, curpart);
            if (rv != EXR_ERR_SUCCESS)
            {
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (!ctxt->is_multipart)
            {
                /* got a terminal mark, not multipart, so finished */
                break;
            }

            rv = scratch.sequential_read (&scratch, &next_byte, 1);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Unable to go to next part definition");
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (next_byte == '\0')
            {
                /* got a second terminator, finished with the
                 * headers, can read chunk offsets next */
                break;
            }

            rv = internal_exr_add_part (ctxt, &curpart, NULL);
        }

        if (rv == EXR_ERR_SUCCESS)
            rv = pull_attr (ctxt, curpart, next_byte, &scratch);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (ctxt->strict_header) { break; }
            rv = EXR_ERR_SUCCESS;
        }
    } while (1);

    if (rv == EXR_ERR_SUCCESS) { rv = update_chunk_offsets (ctxt, &scratch); }

    priv_destroy_scratch (&scratch);
    return internal_exr_context_restore_handlers (ctxt, rv);
}